

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O3

ComponentType __thiscall
dxil_spv::Converter::Impl::get_effective_input_output_type(Impl *this,ComponentType type)

{
  byte bVar1;
  Builder *pBVar2;
  undefined7 in_register_00000031;
  Capability local_c;
  
  bVar1 = 1;
  if ((int)CONCAT71(in_register_00000031,type) == 8) {
    bVar1 = (this->options).min_precision_prefer_native_16bit |
            (this->execution_mode_meta).native_16bit_operations;
  }
  if (((bVar1 & 1) == 0) || ((this->options).storage_16bit_input_output == false)) {
    if (type == F16) {
      type = F32;
    }
    else if (type == U16) {
      type = U32;
    }
    else if (type == I16) {
      type = I32;
    }
  }
  else if ((type < F32) && ((0x10cU >> (type & 0x1f) & 1) != 0)) {
    pBVar2 = SPIRVModule::get_builder(this->spirv_module);
    local_c = CapabilityStorageInputOutput16;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&pBVar2->capabilities,&local_c);
  }
  return type;
}

Assistant:

DXIL::ComponentType Converter::Impl::get_effective_input_output_type(DXIL::ComponentType type)
{
	bool supports_narrow_arith_type = type != DXIL::ComponentType::F16 || support_native_fp16_operations();
	if (options.storage_16bit_input_output && supports_narrow_arith_type)
	{
		if (component_type_is_16bit(type))
			builder().addCapability(spv::CapabilityStorageInputOutput16);
	}
	else
	{
		// Expand/contract on load/store.
		// The only reasonable way this can break is if application relies on
		// lower precision in interpolation, but I don't think you can rely on that
		// kind of implementation detail ...
		type = convert_16bit_component_to_32bit(type);
	}

	return type;
}